

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Sim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pAig;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  Gia_ParSim_t Pars;
  char *local_428;
  char pFileNameOut [1000];
  
  Gia_ManSimSetDefaultParams(&Pars);
  local_428 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_0020b2fa:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"FWNTImvh"), iVar2 = globalUtilOptind, iVar1 == 0x46)
    {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_0020b49c:
        Abc_Print(-1,pcVar6);
        goto LAB_0020b4a6;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nIters = iVar1;
LAB_0020b3a0:
      globalUtilOptind = iVar2 + 1;
      if (iVar1 < 0) goto LAB_0020b4a6;
    }
    if (iVar1 == 0x4e) {
      if (globalUtilOptind < argc) {
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.RandSeed = iVar1;
        goto LAB_0020b3a0;
      }
      pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_0020b49c;
    }
    if (iVar1 == 0x54) {
      if (globalUtilOptind < argc) {
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.TimeLimit = iVar1;
        goto LAB_0020b3a0;
      }
      pcVar6 = "Command line switch \"-T\" should be followed by an integer.\n";
      goto LAB_0020b49c;
    }
    if (iVar1 == 0x57) {
      if (globalUtilOptind < argc) {
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nWords = iVar1;
        goto LAB_0020b3a0;
      }
      pcVar6 = "Command line switch \"-W\" should be followed by an integer.\n";
      goto LAB_0020b49c;
    }
    piVar5 = &Pars.fCheckMiter;
    if (iVar1 == 0x6d) {
LAB_0020b331:
      *(byte *)piVar5 = (byte)*piVar5 ^ 1;
      goto LAB_0020b2fa;
    }
    if (iVar1 == 0x76) {
      piVar5 = &Pars.fVerbose;
      goto LAB_0020b331;
    }
    if (iVar1 == -1) {
      pAig = pAbc->pGia;
      if (pAig != (Gia_Man_t *)0x0) {
        if (pAig->nRegs == 0) {
          Abc_Print(-1,"The network is combinational.\n");
          return 0;
        }
        if (local_428 != (char *)0x0) {
          pcVar6 = Extra_FileNameGeneric(local_428);
          sVar3 = strlen(pcVar6);
          if (sVar3 < 900) {
            pcVar4 = Extra_FileNameExtension(local_428);
            sprintf(pFileNameOut,"%s_out.%s",pcVar6,pcVar4);
            free(pcVar6);
            Gia_ManSimSimulatePattern(pAbc->pGia,local_428,pFileNameOut);
            return 1;
          }
          __assert_fail("strlen(pNameGeneric) < 900",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abc.c"
                        ,0x6da6,"int Abc_CommandAbc9Sim(Abc_Frame_t *, int, char **)");
        }
        pAbc->nFrames = -1;
        iVar2 = Gia_ManSimSimulate(pAig,&Pars);
        pAbc->Status = -(uint)(iVar2 == 0);
        Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
        return 0;
      }
      pcVar6 = "Abc_CommandAbc9Sim(): There is no AIG.\n";
      iVar2 = -1;
      goto LAB_0020b590;
    }
    if (iVar1 != 0x49) goto LAB_0020b4a6;
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-I\" should be followed by an integer.\n";
      goto LAB_0020b49c;
    }
    local_428 = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
    if (local_428 == (char *)0x0) {
LAB_0020b4a6:
      iVar2 = -2;
      Abc_Print(-2,"usage: &sim [-FWNT num] [-mvh] -I <file>\n");
      Abc_Print(-2,"\t         performs random simulation of the sequential miter\n");
      Abc_Print(-2,"\t         (if candidate equivalences are defined, performs refinement)\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",
                (ulong)(uint)Pars.nIters);
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
                (ulong)(uint)Pars.RandSeed);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)Pars.TimeLimit);
      pcVar6 = "miter";
      if (Pars.fCheckMiter == 0) {
        pcVar6 = "circuit";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar6 = 
      "\t-I file: (optional) file with input patterns (one line per frame, as many as PIs)\n";
LAB_0020b590:
      Abc_Print(iVar2,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Sim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_ParSim_t Pars, * pPars = &Pars;
    char * pFileName = NULL;
    int c;
    Gia_ManSimSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWNTImvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->RandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->RandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            if ( pFileName == NULL )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pFileName != NULL )
    {
        extern void Gia_ManSimSimulatePattern( Gia_Man_t * p, char * pFileIn, char * pFileOut );
        char pFileNameOut[1000];
        char * pNameGeneric = Extra_FileNameGeneric(pFileName);
        assert( strlen(pNameGeneric) < 900 );
        sprintf( pFileNameOut, "%s_out.%s", pNameGeneric, Extra_FileNameExtension(pFileName) );
        ABC_FREE( pNameGeneric );
        Gia_ManSimSimulatePattern( pAbc->pGia, pFileName, pFileNameOut );
        return 1;
    }

    pAbc->nFrames = -1;
    if ( Gia_ManSimSimulate( pAbc->pGia, pPars ) )
        pAbc->Status =  0;
    else
        pAbc->Status = -1;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
//    if ( pLogFileName )
//        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&sim" );
    return 0;

usage:
    Abc_Print( -2, "usage: &sim [-FWNT num] [-mvh] -I <file>\n" );
    Abc_Print( -2, "\t         performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t         (if candidate equivalences are defined, performs refinement)\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", pPars->nIters );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n", pPars->RandSeed );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t-I file: (optional) file with input patterns (one line per frame, as many as PIs)\n");
    return 1;
}